

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O1

void duckdb::Printer::RawPrint(OutputStream stream,string *str)

{
  undefined8 *puVar1;
  undefined7 in_register_00000039;
  
  if ((int)CONCAT71(in_register_00000039,stream) == 2) {
    puVar1 = (undefined8 *)&stderr;
  }
  else {
    puVar1 = (undefined8 *)&stdout;
  }
  fputs((str->_M_dataplus)._M_p,(FILE *)*puVar1);
  return;
}

Assistant:

void Printer::RawPrint(OutputStream stream, const string &str) {
#ifndef DUCKDB_DISABLE_PRINT
#ifdef DUCKDB_WINDOWS
	if (IsTerminal(stream)) {
		// print utf8 to terminal
		auto unicode = WindowsUtil::UTF8ToMBCS(str.c_str());
		fprintf(stream == OutputStream::STREAM_STDERR ? stderr : stdout, "%s", unicode.c_str());
		return;
	}
#endif
	fprintf(stream == OutputStream::STREAM_STDERR ? stderr : stdout, "%s", str.c_str());
#endif
}